

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gulcalc.cpp
# Opt level: O0

void __thiscall gulcalc::outputbenchmark(gulcalc *this,int event_id,bool header)

{
  FILE *pFVar1;
  bool bVar2;
  reference this_00;
  size_type sVar3;
  reference pvVar4;
  reference pvVar5;
  pointer ppVar6;
  size_type sVar7;
  _Self local_c8;
  _Self local_c0;
  const_iterator i_3;
  __normal_iterator<const_std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_*,_std::vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>_>
  local_a8;
  __normal_iterator<const_std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_*,_std::vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>_>
  local_a0;
  const_iterator ii_1;
  __normal_iterator<std::vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>_*,_std::vector<std::vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>,_std::allocator<std::vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>_>_>_>
  local_90;
  __normal_iterator<const_std::vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>_*,_std::vector<std::vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>,_std::allocator<std::vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>_>_>_>
  local_88;
  const_iterator i_2;
  __normal_iterator<const_std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_*,_std::vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>_>
  local_70;
  __normal_iterator<const_std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_*,_std::vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>_>
  local_68;
  const_iterator ii;
  __normal_iterator<std::vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>_*,_std::vector<std::vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>,_std::allocator<std::vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>_>_>_>
  local_58;
  __normal_iterator<const_std::vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>_*,_std::vector<std::vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>,_std::allocator<std::vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>_>_>_>
  local_50;
  const_iterator i_1;
  size_t vec2_size;
  __normal_iterator<std::vector<float,_std::allocator<float>_>_*,_std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>
  local_38;
  __normal_iterator<std::vector<float,_std::allocator<float>_>_*,_std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>
  local_30;
  __normal_iterator<const_std::vector<float,_std::allocator<float>_>_*,_std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>
  local_28;
  const_iterator i;
  size_t vec_size;
  bool header_local;
  int event_id_local;
  gulcalc *this_local;
  
  if (header) {
    fprintf(_stderr,
            "event_id,cov,mode1,fullCorr,mode1UsedCoverageIDs,damagebindictionary_vec,item_map,coverages\n"
           );
  }
  else {
    fprintf(_stderr,"%d,",(ulong)(uint)event_id);
    i._M_current = (vector<float,_std::allocator<float>_> *)0x0;
    local_30._M_current =
         (vector<float,_std::allocator<float>_> *)
         std::
         vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
         ::begin(&this->cov_);
    __gnu_cxx::
    __normal_iterator<std::vector<float,std::allocator<float>>const*,std::vector<std::vector<float,std::allocator<float>>,std::allocator<std::vector<float,std::allocator<float>>>>>
    ::__normal_iterator<std::vector<float,std::allocator<float>>*>
              ((__normal_iterator<std::vector<float,std::allocator<float>>const*,std::vector<std::vector<float,std::allocator<float>>,std::allocator<std::vector<float,std::allocator<float>>>>>
                *)&local_28,&local_30);
    while( true ) {
      local_38._M_current =
           (vector<float,_std::allocator<float>_> *)
           std::
           vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
           ::end(&this->cov_);
      bVar2 = __gnu_cxx::operator<(&local_28,&local_38);
      pFVar1 = _stderr;
      if (!bVar2) break;
      this_00 = __gnu_cxx::
                __normal_iterator<const_std::vector<float,_std::allocator<float>_>_*,_std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>
                ::operator*(&local_28);
      sVar3 = std::vector<float,_std::allocator<float>_>::size(this_00);
      i._M_current = (vector<float,_std::allocator<float>_> *)
                     ((long)&((i._M_current)->super__Vector_base<float,_std::allocator<float>_>).
                             _M_impl.super__Vector_impl_data._M_start + sVar3);
      __gnu_cxx::
      __normal_iterator<const_std::vector<float,_std::allocator<float>_>_*,_std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>
      ::operator++(&local_28,0);
    }
    sVar3 = std::
            vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
            ::size(&this->cov_);
    fprintf(pFVar1,"%lu,",sVar3 * 0x18 + 0x18 + (long)i._M_current * 4);
    i._M_current = (vector<float,_std::allocator<float>_> *)0x0;
    i_1._M_current =
         (vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
          *)0x0;
    local_58._M_current =
         (vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
          *)std::
            vector<std::vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>,_std::allocator<std::vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>_>_>
            ::begin(&this->mode1_);
    __gnu_cxx::
    __normal_iterator<std::vector<std::vector<gulItemIDLoss,std::allocator<gulItemIDLoss>>,std::allocator<std::vector<gulItemIDLoss,std::allocator<gulItemIDLoss>>>>const*,std::vector<std::vector<std::vector<gulItemIDLoss,std::allocator<gulItemIDLoss>>,std::allocator<std::vector<gulItemIDLoss,std::allocator<gulItemIDLoss>>>>,std::allocator<std::vector<std::vector<gulItemIDLoss,std::allocator<gulItemIDLoss>>,std::allocator<std::vector<gulItemIDLoss,std::allocator<gulItemIDLoss>>>>>>>
    ::
    __normal_iterator<std::vector<std::vector<gulItemIDLoss,std::allocator<gulItemIDLoss>>,std::allocator<std::vector<gulItemIDLoss,std::allocator<gulItemIDLoss>>>>*>
              ((__normal_iterator<std::vector<std::vector<gulItemIDLoss,std::allocator<gulItemIDLoss>>,std::allocator<std::vector<gulItemIDLoss,std::allocator<gulItemIDLoss>>>>const*,std::vector<std::vector<std::vector<gulItemIDLoss,std::allocator<gulItemIDLoss>>,std::allocator<std::vector<gulItemIDLoss,std::allocator<gulItemIDLoss>>>>,std::allocator<std::vector<std::vector<gulItemIDLoss,std::allocator<gulItemIDLoss>>,std::allocator<std::vector<gulItemIDLoss,std::allocator<gulItemIDLoss>>>>>>>
                *)&local_50,&local_58);
    while( true ) {
      ii._M_current =
           (vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_> *)
           std::
           vector<std::vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>,_std::allocator<std::vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>_>_>
           ::end(&this->mode1_);
      bVar2 = __gnu_cxx::operator<
                        (&local_50,
                         (__normal_iterator<std::vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>_*,_std::vector<std::vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>,_std::allocator<std::vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>_>_>_>
                          *)&ii);
      pFVar1 = _stderr;
      if (!bVar2) break;
      pvVar4 = __gnu_cxx::
               __normal_iterator<const_std::vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>_*,_std::vector<std::vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>,_std::allocator<std::vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>_>_>_>
               ::operator*(&local_50);
      sVar3 = std::
              vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
              ::size(pvVar4);
      i._M_current = (vector<float,_std::allocator<float>_> *)
                     ((long)&((i._M_current)->super__Vector_base<float,_std::allocator<float>_>).
                             _M_impl.super__Vector_impl_data._M_start + sVar3);
      pvVar4 = __gnu_cxx::
               __normal_iterator<const_std::vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>_*,_std::vector<std::vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>,_std::allocator<std::vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>_>_>_>
               ::operator*(&local_50);
      local_68._M_current =
           (vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_> *)
           std::
           vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
           ::begin(pvVar4);
      while( true ) {
        pvVar4 = __gnu_cxx::
                 __normal_iterator<const_std::vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>_*,_std::vector<std::vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>,_std::allocator<std::vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>_>_>_>
                 ::operator*(&local_50);
        local_70._M_current =
             (vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_> *)
             std::
             vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
             ::end(pvVar4);
        bVar2 = __gnu_cxx::operator<(&local_68,&local_70);
        if (!bVar2) break;
        pvVar5 = __gnu_cxx::
                 __normal_iterator<const_std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_*,_std::vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>_>
                 ::operator*(&local_68);
        sVar3 = std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>::size(pvVar5);
        i_1._M_current =
             (vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
              *)((long)&((i_1._M_current)->
                        super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start + sVar3);
        __gnu_cxx::
        __normal_iterator<const_std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_*,_std::vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>_>
        ::operator++(&local_68,0);
      }
      i_2._M_current =
           (vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
            *)__gnu_cxx::
              __normal_iterator<const_std::vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>_*,_std::vector<std::vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>,_std::allocator<std::vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>_>_>_>
              ::operator++(&local_50,0);
    }
    sVar3 = std::
            vector<std::vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>,_std::allocator<std::vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>_>_>
            ::size(&this->mode1_);
    fprintf(pFVar1,"%lu,",
            sVar3 * 0x18 + 0x18 + (long)i._M_current * 0x18 + (long)i_1._M_current * 0x10);
    i._M_current = (vector<float,_std::allocator<float>_> *)0x0;
    i_1._M_current =
         (vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
          *)0x0;
    local_90._M_current =
         (vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
          *)std::
            vector<std::vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>,_std::allocator<std::vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>_>_>
            ::begin(&this->fullCorr_);
    __gnu_cxx::
    __normal_iterator<std::vector<std::vector<gulItemIDLoss,std::allocator<gulItemIDLoss>>,std::allocator<std::vector<gulItemIDLoss,std::allocator<gulItemIDLoss>>>>const*,std::vector<std::vector<std::vector<gulItemIDLoss,std::allocator<gulItemIDLoss>>,std::allocator<std::vector<gulItemIDLoss,std::allocator<gulItemIDLoss>>>>,std::allocator<std::vector<std::vector<gulItemIDLoss,std::allocator<gulItemIDLoss>>,std::allocator<std::vector<gulItemIDLoss,std::allocator<gulItemIDLoss>>>>>>>
    ::
    __normal_iterator<std::vector<std::vector<gulItemIDLoss,std::allocator<gulItemIDLoss>>,std::allocator<std::vector<gulItemIDLoss,std::allocator<gulItemIDLoss>>>>*>
              ((__normal_iterator<std::vector<std::vector<gulItemIDLoss,std::allocator<gulItemIDLoss>>,std::allocator<std::vector<gulItemIDLoss,std::allocator<gulItemIDLoss>>>>const*,std::vector<std::vector<std::vector<gulItemIDLoss,std::allocator<gulItemIDLoss>>,std::allocator<std::vector<gulItemIDLoss,std::allocator<gulItemIDLoss>>>>,std::allocator<std::vector<std::vector<gulItemIDLoss,std::allocator<gulItemIDLoss>>,std::allocator<std::vector<gulItemIDLoss,std::allocator<gulItemIDLoss>>>>>>>
                *)&local_88,&local_90);
    while( true ) {
      ii_1._M_current =
           (vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_> *)
           std::
           vector<std::vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>,_std::allocator<std::vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>_>_>
           ::end(&this->fullCorr_);
      bVar2 = __gnu_cxx::operator<
                        (&local_88,
                         (__normal_iterator<std::vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>_*,_std::vector<std::vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>,_std::allocator<std::vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>_>_>_>
                          *)&ii_1);
      pFVar1 = _stderr;
      if (!bVar2) break;
      pvVar4 = __gnu_cxx::
               __normal_iterator<const_std::vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>_*,_std::vector<std::vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>,_std::allocator<std::vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>_>_>_>
               ::operator*(&local_88);
      sVar3 = std::
              vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
              ::size(pvVar4);
      i._M_current = (vector<float,_std::allocator<float>_> *)
                     ((long)&((i._M_current)->super__Vector_base<float,_std::allocator<float>_>).
                             _M_impl.super__Vector_impl_data._M_start + sVar3);
      pvVar4 = __gnu_cxx::
               __normal_iterator<const_std::vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>_*,_std::vector<std::vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>,_std::allocator<std::vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>_>_>_>
               ::operator*(&local_88);
      local_a0._M_current =
           (vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_> *)
           std::
           vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
           ::begin(pvVar4);
      while( true ) {
        pvVar4 = __gnu_cxx::
                 __normal_iterator<const_std::vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>_*,_std::vector<std::vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>,_std::allocator<std::vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>_>_>_>
                 ::operator*(&local_88);
        local_a8._M_current =
             (vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_> *)
             std::
             vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
             ::end(pvVar4);
        bVar2 = __gnu_cxx::operator<(&local_a0,&local_a8);
        if (!bVar2) break;
        pvVar5 = __gnu_cxx::
                 __normal_iterator<const_std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_*,_std::vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>_>
                 ::operator*(&local_a0);
        sVar3 = std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>::size(pvVar5);
        i_1._M_current =
             (vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
              *)((long)&((i_1._M_current)->
                        super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start + sVar3);
        __gnu_cxx::
        __normal_iterator<const_std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_*,_std::vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>_>
        ::operator++(&local_a0,0);
      }
      i_3._M_node = (_Base_ptr)
                    __gnu_cxx::
                    __normal_iterator<const_std::vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>_*,_std::vector<std::vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>,_std::allocator<std::vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>_>_>_>
                    ::operator++(&local_88,0);
    }
    sVar3 = std::
            vector<std::vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>,_std::allocator<std::vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>_>_>
            ::size(&this->fullCorr_);
    fprintf(pFVar1,"%lu,",
            sVar3 * 0x18 + 0x18 + (long)i._M_current * 0x18 + (long)i_1._M_current * 0x10);
    pFVar1 = _stderr;
    sVar3 = std::vector<int,_std::allocator<int>_>::size(&this->mode1UsedCoverageIDs_);
    fprintf(pFVar1,"%lu,",sVar3 * 4 + 0x18);
    pFVar1 = _stderr;
    sVar3 = std::vector<damagebindictionary,_std::allocator<damagebindictionary>_>::size
                      (this->damagebindictionary_vec_);
    fprintf(pFVar1,"%lu,",sVar3 * 0x14 + 0x18);
    i._M_current = (vector<float,_std::allocator<float>_> *)0x0;
    local_c0._M_node =
         (_Base_ptr)
         std::
         map<item_map_key,_std::vector<item_map_rec,_std::allocator<item_map_rec>_>,_std::less<item_map_key>,_std::allocator<std::pair<const_item_map_key,_std::vector<item_map_rec,_std::allocator<item_map_rec>_>_>_>_>
         ::begin(this->item_map_);
    while( true ) {
      local_c8._M_node =
           (_Base_ptr)
           std::
           map<item_map_key,_std::vector<item_map_rec,_std::allocator<item_map_rec>_>,_std::less<item_map_key>,_std::allocator<std::pair<const_item_map_key,_std::vector<item_map_rec,_std::allocator<item_map_rec>_>_>_>_>
           ::end(this->item_map_);
      bVar2 = std::operator!=(&local_c0,&local_c8);
      pFVar1 = _stderr;
      if (!bVar2) break;
      ppVar6 = std::
               _Rb_tree_const_iterator<std::pair<const_item_map_key,_std::vector<item_map_rec,_std::allocator<item_map_rec>_>_>_>
               ::operator->(&local_c0);
      sVar3 = std::vector<item_map_rec,_std::allocator<item_map_rec>_>::size(&ppVar6->second);
      i._M_current = (vector<float,_std::allocator<float>_> *)
                     ((long)&((i._M_current)->super__Vector_base<float,_std::allocator<float>_>).
                             _M_impl.super__Vector_impl_data._M_start + sVar3);
      std::
      _Rb_tree_const_iterator<std::pair<const_item_map_key,_std::vector<item_map_rec,_std::allocator<item_map_rec>_>_>_>
      ::operator++(&local_c0,0);
    }
    sVar7 = std::
            map<item_map_key,_std::vector<item_map_rec,_std::allocator<item_map_rec>_>,_std::less<item_map_key>,_std::allocator<std::pair<const_item_map_key,_std::vector<item_map_rec,_std::allocator<item_map_rec>_>_>_>_>
            ::size(this->item_map_);
    fprintf(pFVar1,"%lu,",sVar7 * 8 + 0x30 + (long)i._M_current * 0xc);
    pFVar1 = _stderr;
    sVar3 = std::vector<float,_std::allocator<float>_>::size(this->coverages_);
    fprintf(pFVar1,"%lu\n",sVar3 * 4 + 0x18);
  }
  return;
}

Assistant:

void gulcalc::outputbenchmark(const int event_id, bool header=false) {

	if (header) {

		fprintf(stderr, "event_id,cov,mode1,fullCorr,"
				"mode1UsedCoverageIDs,damagebindictionary_vec,"
				"item_map,coverages\n");
		return;
	}

	fprintf(stderr, "%d,", event_id);   // event_id

	// vector<vector<OASIS_FLOAT>> cov_
	size_t vec_size = 0;
	for (std::vector<std::vector<OASIS_FLOAT>>::const_iterator i = cov_.begin(); i < cov_.end(); i++) {
		vec_size += (*i).size();
	}
	fprintf(stderr, "%lu,",
		sizeof(std::vector<std::vector<OASIS_FLOAT>>) +
		  (sizeof(std::vector<OASIS_FLOAT>) * cov_.size()) +
		  (sizeof(OASIS_FLOAT) * vec_size));

	// vector<vector<vector<gulItemIDLoss>>> mode1_
	vec_size = 0;
	size_t vec2_size = 0;
	for (std::vector<std::vector<std::vector<gulItemIDLoss>>>::const_iterator i = mode1_.begin(); i < mode1_.end(); i++) {
		vec_size += (*i).size();
		for (std::vector<std::vector<gulItemIDLoss>>::const_iterator ii = (*i).begin(); ii < (*i).end(); ii++) {
			vec2_size += (*ii).size();
		}
	}
	fprintf(stderr, "%lu,",
		sizeof(std::vector<std::vector<std::vector<gulItemIDLoss>>>) +
		  (sizeof(std::vector<std::vector<gulItemIDLoss>>) * mode1_.size()) +
		  (sizeof(std::vector<gulItemIDLoss>) * vec_size) +
		  (sizeof(gulItemIDLoss) * vec2_size));

	// vector<vector<vector<gulItemIDLoss>>> fullCorr_
	vec_size = 0;
	vec2_size = 0;
	for (std::vector<std::vector<std::vector<gulItemIDLoss>>>::const_iterator i = fullCorr_.begin(); i < fullCorr_.end(); i++) {
		vec_size += (*i).size();
		for (std::vector<std::vector<gulItemIDLoss>>::const_iterator ii = (*i).begin(); ii < (*i).end(); ii++) {
			vec2_size += (*ii).size();
		}
	}
	fprintf(stderr, "%lu,",
		sizeof(std::vector<std::vector<std::vector<gulItemIDLoss>>>) +
		  (sizeof(std::vector<std::vector<gulItemIDLoss>>) * fullCorr_.size()) +
		  (sizeof(std::vector<gulItemIDLoss>) * vec_size) +
		  (sizeof(gulItemIDLoss) * vec2_size));

	// vector<int> mode1UsedCoverageIDs_
	fprintf(stderr, "%lu,",
		sizeof(std::vector<int>) +
		  (sizeof(int) * mode1UsedCoverageIDs_.size()));

	// vector<damagebindictionary> *damagebindictionary_vec_
	fprintf(stderr, "%lu,",
		sizeof(std::vector<damagebindictionary>) +
		  (sizeof(damagebindictionary) * (*damagebindictionary_vec_).size()));

	// map<item_map_key, vector<item_map_rec>> *iutem_map_
	vec_size = 0;
	for (std::map<item_map_key, std::vector<item_map_rec>>::const_iterator i = (*item_map_).begin(); i != (*item_map_).end(); i++) {
		vec_size += i->second.size();
	}
	fprintf(stderr, "%lu,",
		sizeof(std::map<item_map_key, vector<item_map_rec>>) +
		  (sizeof(item_map_key) * (*item_map_).size()) +
		  (sizeof(item_map_rec) * vec_size));

	// vector<OASIS_FLOAT> *coverages_
	fprintf(stderr, "%lu\n",
		sizeof(std::vector<OASIS_FLOAT>) +
		  (sizeof(OASIS_FLOAT) * (*coverages_).size()));

	return;

}